

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

void upb::generator::WriteMiniTableMultipleSources
               (DefPoolPair *pools,FileDefPtr file,MiniTableOptions *options,Plugin *plugin)

{
  MessageDefPtr message;
  EnumDefPtr e;
  FieldDefPtr ext;
  Plugin *pPVar1;
  string *psVar2;
  FileDefPtr file_00;
  FileDefPtr file_01;
  FileDefPtr file_02;
  pointer pEVar3;
  pointer pFVar4;
  int *in_R9;
  pointer pMVar5;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  string_view full_name;
  string_view content;
  string_view full_name_00;
  string_view content_00;
  string_view full_name_01;
  string_view content_01;
  int i;
  Output output;
  string local_a0;
  DefPoolPair *local_80;
  vector<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_> enums;
  vector<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_> extensions;
  vector<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_> messages;
  
  pPVar1 = plugin;
  local_80 = pools;
  SortedMessages(&messages,file);
  SortedExtensions(&extensions,file);
  SortedEnums(&enums,file,kClosedEnums);
  i = 0;
  for (pMVar5 = messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar5 != messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>
                ._M_impl.super__Vector_impl_data._M_finish; pMVar5 = pMVar5 + 1) {
    message.ptr_ = pMVar5->ptr_;
    output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
    output.output_._M_string_length = 0;
    output.output_.field_2._M_local_buf[0] = '\0';
    WriteMiniTableSourceIncludes(file,options,&output);
    psVar2 = (string *)&output;
    anon_unknown_5::WriteMessage(message,local_80,options,&output);
    upb_MessageDef_FullName(message.ptr_);
    full_name._M_str = (char *)&i;
    full_name._M_len = (size_t)psVar2;
    MultipleSourceFilename_abi_cxx11_(&local_a0,(generator *)file.ptr_,file_00,full_name,in_R9);
    filename._M_str = local_a0._M_dataplus._M_p;
    filename._M_len = local_a0._M_string_length;
    content._M_str = output.output_._M_dataplus._M_p;
    content._M_len = output.output_._M_string_length;
    pPVar1 = (Plugin *)output.output_._M_string_length;
    Plugin::AddOutputFile(plugin,filename,content);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&output);
  }
  for (pEVar3 = enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
                super__Vector_impl_data._M_start;
      pEVar3 != enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>._M_impl.
                super__Vector_impl_data._M_finish; pEVar3 = pEVar3 + 1) {
    e.ptr_ = pEVar3->ptr_;
    output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
    output.output_._M_string_length = 0;
    output.output_.field_2._M_local_buf[0] = '\0';
    WriteMiniTableSourceIncludes(file,options,&output);
    anon_unknown_5::WriteEnum(e,&output);
    upb_EnumDef_FullName(e.ptr_);
    full_name_00._M_str = (char *)&i;
    full_name_00._M_len = (size_t)pPVar1;
    MultipleSourceFilename_abi_cxx11_(&local_a0,(generator *)file.ptr_,file_01,full_name_00,in_R9);
    filename_00._M_str = local_a0._M_dataplus._M_p;
    filename_00._M_len = local_a0._M_string_length;
    content_00._M_str = output.output_._M_dataplus._M_p;
    content_00._M_len = output.output_._M_string_length;
    pPVar1 = (Plugin *)output.output_._M_string_length;
    Plugin::AddOutputFile(plugin,filename_00,content_00);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&output);
  }
  for (pFVar4 = extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                _M_impl.super__Vector_impl_data._M_start;
      pFVar4 != extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>.
                _M_impl.super__Vector_impl_data._M_finish; pFVar4 = pFVar4 + 1) {
    ext.ptr_ = pFVar4->ptr_;
    output.output_._M_dataplus._M_p = (pointer)&output.output_.field_2;
    output.output_._M_string_length = 0;
    output.output_.field_2._M_local_buf[0] = '\0';
    WriteMiniTableSourceIncludes(file,options,&output);
    anon_unknown_5::WriteExtension(local_80,ext,&output);
    upb_FieldDef_FullName(ext.ptr_);
    full_name_01._M_str = (char *)&i;
    full_name_01._M_len = (size_t)pPVar1;
    MultipleSourceFilename_abi_cxx11_(&local_a0,(generator *)file.ptr_,file_02,full_name_01,in_R9);
    filename_01._M_str = local_a0._M_dataplus._M_p;
    filename_01._M_len = local_a0._M_string_length;
    content_01._M_str = output.output_._M_dataplus._M_p;
    content_01._M_len = output.output_._M_string_length;
    pPVar1 = (Plugin *)output.output_._M_string_length;
    Plugin::AddOutputFile(plugin,filename_01,content_01);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&output);
  }
  std::_Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>::~_Vector_base
            (&enums.super__Vector_base<upb::EnumDefPtr,_std::allocator<upb::EnumDefPtr>_>);
  std::_Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>::~_Vector_base
            (&extensions.super__Vector_base<upb::FieldDefPtr,_std::allocator<upb::FieldDefPtr>_>);
  std::_Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>::~_Vector_base
            (&messages.super__Vector_base<upb::MessageDefPtr,_std::allocator<upb::MessageDefPtr>_>);
  return;
}

Assistant:

void WriteMiniTableMultipleSources(const DefPoolPair& pools,
                                   upb::FileDefPtr file,
                                   const MiniTableOptions& options,
                                   Plugin* plugin) {
  std::vector<upb::MessageDefPtr> messages = SortedMessages(file);
  std::vector<upb::FieldDefPtr> extensions = SortedExtensions(file);
  std::vector<upb::EnumDefPtr> enums = SortedEnums(file, kClosedEnums);
  int i = 0;

  for (auto message : messages) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteMessage(message, pools, options, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, message.full_name(), &i),
                          output.output());
  }
  for (const auto e : enums) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteEnum(e, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, e.full_name(), &i),
                          output.output());
  }
  for (const auto ext : extensions) {
    Output output;
    WriteMiniTableSourceIncludes(file, options, output);
    WriteExtension(pools, ext, output);
    plugin->AddOutputFile(MultipleSourceFilename(file, ext.full_name(), &i),
                          output.output());
  }
}